

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O2

AWeapon * __thiscall APlayerPawn::BestWeapon(APlayerPawn *this,PClassAmmo *ammotype)

{
  byte bVar1;
  bool bVar2;
  AInventory *pAVar3;
  AWeapon *this_00;
  AAmmo *pAVar4;
  PClassAmmo *pPVar5;
  AWeapon *pAVar6;
  int iVar7;
  AWeapon *local_38;
  
  pAVar3 = AActor::FindInventory
                     (&this->super_AActor,
                      (PClassActor *)APowerWeaponLevel2::RegistrationInfo.MyClass,true);
  this_00 = (AWeapon *)GC::ReadBarrier<AInventory>((AInventory **)&(this->super_AActor).Inventory);
  iVar7 = 0x7fffffff;
  local_38 = (AWeapon *)0x0;
  do {
    if (this_00 == (AWeapon *)0x0) {
      return local_38;
    }
    bVar2 = DObject::IsKindOf((DObject *)this_00,AWeapon::RegistrationInfo.MyClass);
    if ((bVar2) && (this_00->SelectionOrder <= iVar7)) {
      if (ammotype == (PClassAmmo *)0x0) {
LAB_00462e3c:
        if (pAVar3 == (AInventory *)0x0) {
          bVar1 = (this_00->super_AStateProvider).super_AInventory.field_0x4fd;
joined_r0x00462e70:
          if ((bVar1 & 4) != 0) goto LAB_00462dfa;
        }
        else {
          pAVar6 = GC::ReadBarrier<AWeapon>((AWeapon **)&this_00->SisterWeapon);
          if (pAVar6 != (AWeapon *)0x0) {
            pAVar6 = GC::ReadBarrier<AWeapon>((AWeapon **)&this_00->SisterWeapon);
            bVar1 = (pAVar6->super_AStateProvider).super_AInventory.field_0x4fd;
            goto joined_r0x00462e70;
          }
        }
        if ((((this_00->super_AStateProvider).super_AInventory.field_0x4fc & 0x20) != 0) ||
           (bVar2 = AWeapon::CheckAmmo(this_00,0,false,false,-1), bVar2)) {
          if (0 < this_00->MinSelAmmo1) {
            pAVar4 = GC::ReadBarrier<AAmmo>((AAmmo **)&this_00->Ammo1);
            if ((pAVar4 == (AAmmo *)0x0) ||
               (pAVar4 = GC::ReadBarrier<AAmmo>((AAmmo **)&this_00->Ammo1),
               (pAVar4->super_AInventory).Amount < this_00->MinSelAmmo1)) goto LAB_00462dfa;
          }
          if (0 < this_00->MinSelAmmo2) {
            pAVar4 = GC::ReadBarrier<AAmmo>((AAmmo **)&this_00->Ammo2);
            if ((pAVar4 == (AAmmo *)0x0) ||
               (pAVar4 = GC::ReadBarrier<AAmmo>((AAmmo **)&this_00->Ammo2),
               (pAVar4->super_AInventory).Amount < this_00->MinSelAmmo2)) goto LAB_00462dfa;
          }
          iVar7 = this_00->SelectionOrder;
          local_38 = this_00;
        }
      }
      else {
        pAVar4 = GC::ReadBarrier<AAmmo>((AAmmo **)&this_00->Ammo1);
        if (pAVar4 != (AAmmo *)0x0) {
          pAVar4 = GC::ReadBarrier<AAmmo>((AAmmo **)&this_00->Ammo1);
          pPVar5 = (PClassAmmo *)DObject::GetClass((DObject *)pAVar4);
          if (pPVar5 == ammotype) goto LAB_00462e3c;
        }
      }
    }
LAB_00462dfa:
    this_00 = (AWeapon *)
              GC::ReadBarrier<AInventory>
                        ((AInventory **)
                         &(this_00->super_AStateProvider).super_AInventory.super_AActor.Inventory);
  } while( true );
}

Assistant:

AWeapon *APlayerPawn::BestWeapon(PClassAmmo *ammotype)
{
	AWeapon *bestMatch = NULL;
	int bestOrder = INT_MAX;
	AInventory *item;
	AWeapon *weap;
	bool tomed = NULL != FindInventory (RUNTIME_CLASS(APowerWeaponLevel2), true);

	// Find the best weapon the player has.
	for (item = Inventory; item != NULL; item = item->Inventory)
	{
		if (!item->IsKindOf (RUNTIME_CLASS(AWeapon)))
			continue;

		weap = static_cast<AWeapon *> (item);

		// Don't select it if it's worse than what was already found.
		if (weap->SelectionOrder > bestOrder)
			continue;

		// Don't select it if its primary fire doesn't use the desired ammo.
		if (ammotype != NULL &&
			(weap->Ammo1 == NULL ||
			 weap->Ammo1->GetClass() != ammotype))
			continue;

		// Don't select it if the Tome is active and this isn't the powered-up version.
		if (tomed && weap->SisterWeapon != NULL && weap->SisterWeapon->WeaponFlags & WIF_POWERED_UP)
			continue;

		// Don't select it if it's powered-up and the Tome is not active.
		if (!tomed && weap->WeaponFlags & WIF_POWERED_UP)
			continue;

		// Don't select it if there isn't enough ammo to use its primary fire.
		if (!(weap->WeaponFlags & WIF_AMMO_OPTIONAL) &&
			!weap->CheckAmmo (AWeapon::PrimaryFire, false))
			continue;

		// Don't select if if there isn't enough ammo as determined by the weapon's author.
		if (weap->MinSelAmmo1 > 0 && (weap->Ammo1 == NULL || weap->Ammo1->Amount < weap->MinSelAmmo1))
			continue;
		if (weap->MinSelAmmo2 > 0 && (weap->Ammo2 == NULL || weap->Ammo2->Amount < weap->MinSelAmmo2))
			continue;

		// This weapon is usable!
		bestOrder = weap->SelectionOrder;
		bestMatch = weap;
	}
	return bestMatch;
}